

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O1

void ParseSpriteFrames(PClassActor *info,TArray<FState,_FState> *states,
                      TArray<FScriptPosition,_FScriptPosition> *SourceLines,FScanner *sc)

{
  uint8_t uVar1;
  char cVar2;
  uint uVar3;
  FState *pFVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  uint8_t uVar8;
  uint16_t uVar9;
  char *stop;
  long local_50;
  FScriptPosition local_40;
  
  pcVar6 = strtok(sc->String,",\t\n\r");
  if (pcVar6 == (char *)0x0) {
    return;
  }
  uVar1 = info->DefaultStateUsage;
  uVar8 = '\0';
  uVar9 = 0;
LAB_00540498:
  pcVar6 = pcVar6 + -1;
  do {
    pcVar7 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar7 == ' ');
  pcVar7 = strchr(pcVar6,0x3a);
  if (pcVar7 == (char *)0x0) {
    local_50 = 4;
  }
  else {
    *pcVar7 = '\0';
    local_50 = strtol(pcVar6,(char **)&local_40,10);
    if ((int)local_50 - 0xffffU < 0xffff0002 || pcVar6 == local_40.FileName.Chars) {
      FScanner::ScriptError(sc,"Rates must be in the range [0,65534]");
    }
    pcVar6 = pcVar7 + 1;
  }
  bVar5 = true;
  do {
    cVar2 = *pcVar6;
    if (cVar2 != ' ') {
      if (cVar2 == '*') {
        if (bVar5) {
          FScanner::ScriptError(sc,"* must come after a frame");
        }
        uVar9 = 4;
      }
      else {
        if (cVar2 == '\0') break;
        if ((byte)(cVar2 + 0xa2U) < 0xe3) {
          FScanner::ScriptError(sc,"Frames must be A-Z, [, \\, or ]");
        }
        else {
          if (!bVar5) {
            TArray<FState,_FState>::Grow(states,1);
            pFVar4 = states->Array;
            uVar3 = states->Count;
            pFVar4[uVar3].sprite = 0;
            pFVar4[uVar3].NextState = (FState *)0x0;
            pFVar4[uVar3].ActionFunc = (VMFunction *)0x0;
            pFVar4[uVar3].Tics = (int16_t)local_50;
            pFVar4[uVar3].TicRange = 0;
            pFVar4[uVar3].Light = 0;
            pFVar4[uVar3].StateFlags = uVar9;
            pFVar4[uVar3].Frame = uVar8;
            pFVar4[uVar3].UseFlags = uVar1;
            *(undefined8 *)&pFVar4[uVar3].DefineFlags = 0;
            *(undefined2 *)((long)&pFVar4[uVar3].Misc2 + 2) = 0;
            states->Count = states->Count + 1;
            FScriptPosition::FScriptPosition(&local_40,sc);
            TArray<FScriptPosition,_FScriptPosition>::Grow(SourceLines,1);
            FScriptPosition::FScriptPosition(SourceLines->Array + SourceLines->Count,&local_40);
            SourceLines->Count = SourceLines->Count + 1;
            FString::~FString(&local_40.FileName);
          }
          uVar8 = *pcVar6 + 0xbf;
          bVar5 = false;
        }
      }
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
  if (!bVar5) {
    TArray<FState,_FState>::Grow(states,1);
    pFVar4 = states->Array;
    uVar3 = states->Count;
    pFVar4[uVar3].sprite = 0;
    pFVar4[uVar3].NextState = (FState *)0x0;
    pFVar4[uVar3].ActionFunc = (VMFunction *)0x0;
    pFVar4[uVar3].Tics = (int16_t)local_50;
    pFVar4[uVar3].TicRange = 0;
    pFVar4[uVar3].Light = 0;
    pFVar4[uVar3].StateFlags = uVar9;
    pFVar4[uVar3].Frame = uVar8;
    pFVar4[uVar3].UseFlags = uVar1;
    *(undefined8 *)&pFVar4[uVar3].DefineFlags = 0;
    *(undefined2 *)((long)&pFVar4[uVar3].Misc2 + 2) = 0;
    states->Count = states->Count + 1;
    FScriptPosition::FScriptPosition(&local_40,sc);
    TArray<FScriptPosition,_FScriptPosition>::Grow(SourceLines,1);
    FScriptPosition::FScriptPosition(SourceLines->Array + SourceLines->Count,&local_40);
    SourceLines->Count = SourceLines->Count + 1;
    FString::~FString(&local_40.FileName);
  }
  pcVar6 = strtok((char *)0x0,",\t\n\r");
  if (pcVar6 == (char *)0x0) {
    return;
  }
  goto LAB_00540498;
}

Assistant:

static void ParseSpriteFrames (PClassActor *info, TArray<FState> &states, TArray<FScriptPosition> &SourceLines, FScanner &sc)
{
	FState state;
	char *token = strtok (sc.String, ",\t\n\r");

	memset (&state, 0, sizeof(state));
	state.UseFlags = info->DefaultStateUsage;

	while (token != NULL)
	{
		// Skip leading white space
		while (*token == ' ')
			token++;

		int rate = 4;
		bool firstState = true;
		char *colon = strchr (token, ':');

		if (colon != NULL)
		{
			char *stop;

			*colon = 0;
			rate = strtol (token, &stop, 10);
			if (stop == token || rate < 1 || rate > 65534)
			{
				sc.ScriptError ("Rates must be in the range [0,65534]");
			}
			token = colon + 1;
		}

		state.Tics = rate;
		state.TicRange = 0;

		while (*token)
		{
			if (*token == ' ')
			{
			}
			else if (*token == '*')
			{
				if (firstState)
				{
					sc.ScriptError ("* must come after a frame");
				}
				state.StateFlags |= STF_FULLBRIGHT;
			}
			else if (*token < 'A' || *token > ']')
			{
				sc.ScriptError ("Frames must be A-Z, [, \\, or ]");
			}
			else
			{
				if (!firstState)
				{
					states.Push (state);
					SourceLines.Push(sc);
				}
				firstState = false;
				state.Frame = *token-'A';	
			}
			++token;
		}
		if (!firstState)
		{
			states.Push (state);
			SourceLines.Push(sc);
		}

		token = strtok (NULL, ",\t\n\r");
	}
}